

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

uint16_t tableQuantize(uint16_t src,float errTol,float srcFloat,int doprint)

{
  imath_half_bits_t h;
  imath_half_bits_t h_00;
  imath_half_bits_t h_01;
  imath_half_bits_t h_02;
  int in_ESI;
  uint16_t in_DI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float ft4;
  float ft3;
  float ft2;
  float ft1;
  uint16_t res;
  uint16_t tmp4;
  uint16_t tmp3;
  uint16_t tmp2;
  uint16_t tmp1;
  uint16_t *closest;
  int numSetBits;
  imath_half_bits_t local_2a;
  imath_half_bits_t *local_20;
  uint local_14;
  imath_half_bits_t local_2;
  
  local_14 = countSetBits(in_DI);
  local_20 = (imath_half_bits_t *)
             (&internal_test_ns::closestData +
             (ulong)*(uint *)(internal_test_ns::closestDataOffset + (ulong)in_DI * 4) * 2);
  if (in_ESI != 0) {
    printf("TABLE 0x%04X %g bits %d tol %g\n",(double)in_XMM1_Da,(double)in_XMM0_Da,(ulong)in_DI,
           (ulong)local_14);
  }
  do {
    local_2 = in_DI;
    if ((int)local_14 < 4) {
LAB_00126e19:
      if (local_14 == 1) {
        fVar1 = imath_half_to_float(*local_20);
        if (ABS(fVar1 - in_XMM1_Da) < in_XMM0_Da) {
          local_2 = *local_20;
        }
      }
      else if (local_14 == 2) {
        fVar1 = imath_half_to_float(*local_20);
        if (in_XMM0_Da <= ABS(fVar1 - in_XMM1_Da)) {
          fVar1 = imath_half_to_float(local_20[1]);
          if (ABS(fVar1 - in_XMM1_Da) < in_XMM0_Da) {
            local_2 = local_20[1];
          }
        }
        else {
          local_2 = *local_20;
        }
      }
      else if (local_14 == 3) {
        fVar1 = imath_half_to_float(*local_20);
        if (in_XMM0_Da <= ABS(fVar1 - in_XMM1_Da)) {
          fVar1 = imath_half_to_float(local_20[1]);
          if (in_XMM0_Da <= ABS(fVar1 - in_XMM1_Da)) {
            fVar1 = imath_half_to_float(local_20[2]);
            if (ABS(fVar1 - in_XMM1_Da) < in_XMM0_Da) {
              local_2 = local_20[2];
            }
          }
          else {
            local_2 = local_20[1];
          }
        }
        else {
          local_2 = *local_20;
        }
      }
      if (in_ESI != 0) {
        printf("    ===> 0x%04X\n",(ulong)local_2);
      }
      return local_2;
    }
    h = *local_20;
    h_00 = local_20[1];
    h_01 = local_20[2];
    h_02 = local_20[3];
    fVar1 = imath_half_to_float(h);
    fVar2 = imath_half_to_float(h_00);
    fVar3 = imath_half_to_float(h_01);
    fVar4 = imath_half_to_float(h_02);
    local_2a = in_DI;
    if (ABS(fVar4 - in_XMM1_Da) < in_XMM0_Da) {
      local_2a = h_02;
    }
    if (ABS(fVar3 - in_XMM1_Da) < in_XMM0_Da) {
      local_2a = h_01;
    }
    if (ABS(fVar2 - in_XMM1_Da) < in_XMM0_Da) {
      local_2a = h_00;
    }
    if (ABS(fVar1 - in_XMM1_Da) < in_XMM0_Da) {
      local_2a = h;
    }
    if (local_2a != in_DI) {
      local_14 = 0;
      local_2 = local_2a;
      goto LAB_00126e19;
    }
    local_20 = local_20 + 4;
    local_14 = local_14 - 4;
  } while( true );
}

Assistant:

static uint16_t tableQuantize (uint16_t src, float errTol, float srcFloat, int doprint)
{
    // pre-quantize float -> half and back
    //uint16_t src      = float_to_half (dctval);
    //float    srcFloat = imath_half_to_float (src);

    int             numSetBits = countSetBits (src);
    const uint16_t* closest    = internal_test_ns::closestData;
    closest += internal_test_ns::closestDataOffset[src];

    if (doprint)
    {
        printf ("TABLE 0x%04X %g bits %d tol %g\n", src, srcFloat, numSetBits, errTol);
    }

    while ( numSetBits >= 4 )
    {
        uint16_t tmp1 = closest[0];
        uint16_t tmp2 = closest[1];
        uint16_t tmp3 = closest[2];
        uint16_t tmp4 = closest[3];
        uint16_t res = src;

        // when compiling for f16c, gcc has no problem collapsing this
        // to 1 cvtph2ps and m128 float math assume the same will be
        // true for neon and ARM...
        float ft1 = fabsf (imath_half_to_float (tmp1) - srcFloat);
        float ft2 = fabsf (imath_half_to_float (tmp2) - srcFloat);
        float ft3 = fabsf (imath_half_to_float (tmp3) - srcFloat);
        float ft4 = fabsf (imath_half_to_float (tmp4) - srcFloat);

        // do in reverse order such that vectorizer can more easily notice the
        // similar comparisons and do the mask and reduce
        if (ft4 < errTol) res = tmp4;
        if (ft3 < errTol) res = tmp3;
        if (ft2 < errTol) res = tmp2;
        if (ft1 < errTol) res = tmp1;

        if (res != src)
        {
            numSetBits = 0;
            src = res;
            break;
        }

        closest += 4;
        numSetBits -= 4;
    }

    switch (numSetBits)
    {
        case 3:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            else if (fabsf (imath_half_to_float (closest[1]) - srcFloat) < errTol)
            {
                src = closest[1];
            }
            else if (fabsf (imath_half_to_float (closest[2]) - srcFloat) < errTol)
            {
                src = closest[2];
            }
            break;
        case 2:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            else if (fabsf (imath_half_to_float (closest[1]) - srcFloat) < errTol)
            {
                src = closest[1];
            }
            break;
        case 1:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            break;
        default:
            break;
    }
#if 0
    for (int targetNumSetBits = numSetBits - 1;
          targetNumSetBits >= 0;
          --targetNumSetBits)
     {
         uint16_t tmp = *closest;

         if (doprint)
             printf ("  consider 0x%04X %g => %g < %g\n", tmp,
                     imath_half_to_float (tmp),
                     fabsf (imath_half_to_float (tmp) - srcFloat),
                     errTol);
         if (fabsf (imath_half_to_float (tmp) - srcFloat) < errTol)
         {
             if (doprint)
                 printf ("    ===> tbits %d 0x%04X\n", targetNumSetBits, tmp);
             return tmp;
         }

         closest++;
     }
     if (doprint)
         printf ("    ===> nothing better 0x%04X\n", src);
#else
     if (doprint)
         printf ("    ===> 0x%04X\n", src);
#endif

     return src;
}